

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O3

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  uint8 uVar1;
  hmm_context_t *phVar2;
  int32 *piVar3;
  uint8 ***pppuVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int32 iVar12;
  uint16 uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  
  phVar2 = hmm->ctx;
  uVar1 = hmm->mpx;
  uVar8 = hmm->senid[0];
  if (uVar1 == '\0') {
    if (uVar8 == 0xffff) {
      iVar11 = -0x20000000;
      goto LAB_0012bee4;
    }
  }
  else {
    iVar11 = -0x20000000;
    if ((uVar8 == 0xffff) || (uVar8 = *phVar2->sseq[uVar8], uVar8 == 0xffff)) goto LAB_0012bee4;
  }
  iVar11 = -(int)phVar2->senscore[uVar8];
LAB_0012bee4:
  piVar3 = phVar2->st_sen_scr;
  *piVar3 = iVar11 + hmm->score[0];
  uVar10 = (ulong)hmm->n_emit_state;
  if (1 < hmm->n_emit_state) {
    lVar6 = 0;
    do {
      uVar13 = hmm->senid[lVar6 + 1];
      if (uVar1 == '\0') {
        if (uVar13 != 0xffff) goto LAB_0012bf47;
        iVar11 = -0x20000000;
      }
      else {
        iVar11 = -0x20000000;
        if ((uVar13 != 0xffff) && (uVar13 = phVar2->sseq[uVar13][lVar6 + 1], uVar13 != 0xffff)) {
LAB_0012bf47:
          iVar11 = -(int)phVar2->senscore[uVar13];
        }
      }
      iVar12 = iVar11 + hmm->score[lVar6 + 1];
      if (iVar12 < -0x1fffffff) {
        iVar12 = -0x20000000;
      }
      piVar3[lVar6 + 1] = iVar12;
      uVar10 = (ulong)hmm->n_emit_state;
      uVar7 = lVar6 + 2;
      lVar6 = lVar6 + 1;
    } while (uVar7 < uVar10);
  }
  if ((char)uVar10 == '\0') {
    hmm->out_score = -0x20000000;
    iVar11 = -0x20000000;
  }
  else {
    uVar14 = (int)uVar10 - 1;
    uVar7 = (ulong)uVar14;
    uVar15 = 0xffffffff;
    iVar11 = -0x20000000;
    lVar6 = uVar7 + 1;
    do {
      if ((phVar2->tp[hmm->tmatid][lVar6 + -1][uVar10] != 0xff) &&
         (iVar16 = piVar3[lVar6 + -1] - (uint)phVar2->tp[hmm->tmatid][lVar6 + -1][uVar10],
         iVar11 < iVar16)) {
        uVar15 = (ulong)uVar14;
        iVar11 = iVar16;
      }
      uVar14 = uVar14 - 1;
      lVar20 = lVar6 + -1;
      bVar5 = 0 < lVar6;
      lVar6 = lVar20;
    } while (lVar20 != 0 && bVar5);
    hmm->out_score = iVar11;
    if (-1 < (int)uVar15) {
      hmm->out_history = hmm->history[uVar15];
    }
    if ((int)uVar10 != 0) {
      pppuVar4 = phVar2->tp;
      uVar15 = uVar7;
      do {
        uVar7 = uVar7 - 1;
        uVar14 = (uint)pppuVar4[hmm->tmatid][uVar15][uVar15];
        if (uVar14 == 0xff) {
          iVar16 = -0x20000000;
        }
        else {
          iVar16 = piVar3[uVar15] - uVar14;
        }
        if ((long)uVar15 < 1) {
          if (uVar15 == 0) {
            hmm->score[0] = iVar16;
          }
          else {
            hmm->score[uVar15] = iVar16;
          }
          if (iVar11 <= iVar16) {
            iVar11 = iVar16;
          }
          break;
        }
        uVar14 = 0xffffffff;
        iVar9 = (int)uVar10;
        uVar18 = uVar7;
        do {
          uVar19 = (uint)pppuVar4[hmm->tmatid][uVar18 & 0xffffffff][uVar15];
          if (uVar19 != 0xff) {
            iVar17 = piVar3[uVar18 & 0xffffffff] - uVar19;
            if (iVar16 < iVar17) {
              iVar16 = iVar17;
              uVar14 = (int)uVar10 - 2;
            }
          }
          uVar19 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar19;
          uVar18 = uVar18 - 1;
        } while (1 < (int)uVar19);
        hmm->score[uVar15] = iVar16;
        if (-1 < (int)uVar14) {
          hmm->history[uVar15] = hmm->history[uVar14];
          if (uVar1 != '\0') {
            hmm->senid[uVar15] = hmm->senid[uVar14];
          }
        }
        if (iVar11 <= iVar16) {
          iVar11 = iVar16;
        }
        uVar10 = (ulong)(iVar9 - 1);
        bVar5 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar5);
    }
  }
  hmm->bestscore = iVar11;
  return iVar11;
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) WORSE_THAN WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) BETTER_THAN TMAT_WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        /* Propagate ssid for multiplex HMMs */
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->senid[to] = hmm->senid[bestfrom];

        if (bestscr WORSE_THAN scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}